

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O3

string * __thiscall
google::(anonymous_namespace)::CommandLineFlagParser::ProcessSingleOptionLocked_abi_cxx11_
          (string *__return_storage_ptr__,void *this,CommandLineFlag *flag,char *value,
          FlagSettingMode set_mode)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  mapped_type *pmVar5;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string local_90;
  string local_70;
  string local_50;
  
  paVar1 = &local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)paVar1;
  if (value != (char *)0x0) {
    anon_unknown_1::CommandLineFlag::UpdateModifiedBit(flag);
    if (set_mode == SET_FLAGS_DEFAULT) {
      bVar3 = anon_unknown_1::TryParseLocked(flag,flag->defvalue_,value,&local_70);
      if (!bVar3) goto LAB_00190268;
      if (flag->modified_ == false) {
        anon_unknown_1::TryParseLocked(flag,flag->current_,value,(string *)0x0);
      }
    }
    else {
      if (set_mode == SET_FLAG_IF_DEFAULT) {
        if (flag->modified_ != false) {
          pcVar2 = flag->name_;
          FlagValue::ToString_abi_cxx11_(&local_50,flag->current_->value_buffer_);
          StringPrintf_abi_cxx11_(&local_90,"%s set to %s",pcVar2,local_50._M_dataplus._M_p);
          std::__cxx11::string::operator=((string *)&local_70,(string *)&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          goto LAB_001901c3;
        }
        bVar3 = anon_unknown_1::TryParseLocked(flag,flag->current_,value,&local_70);
      }
      else {
        if (set_mode != SET_FLAGS_VALUE) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/gflags.cc"
                        ,0x37e,
                        "bool google::(anonymous namespace)::FlagRegistry::SetFlagLocked(CommandLineFlag *, const char *, FlagSettingMode, string *)"
                       );
        }
        bVar3 = anon_unknown_1::TryParseLocked(flag,flag->current_,value,&local_70);
      }
      if (bVar3 == false) {
LAB_00190268:
        std::__cxx11::string::string((string *)&local_90,flag->name_,(allocator *)&local_50);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)((long)this + 8),&local_90);
        std::__cxx11::string::_M_assign((string *)pmVar5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p == paVar1) {
          return extraout_RAX;
        }
        operator_delete(local_70._M_dataplus._M_p);
        return extraout_RAX_00;
      }
      flag->modified_ = true;
    }
  }
LAB_001901c3:
  pcVar2 = flag->name_;
  iVar4 = strcmp(pcVar2,"flagfile");
  if (iVar4 == 0) {
    anon_unknown_1::CommandLineFlagParser::ProcessFlagfileLocked
              (&local_90,(CommandLineFlagParser *)this,fLS::FLAGS_flagfile_abi_cxx11_,set_mode);
    std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90._M_dataplus._M_p);
  }
  else {
    iVar4 = strcmp(pcVar2,"fromenv");
    if (iVar4 == 0) {
      anon_unknown_1::CommandLineFlagParser::ProcessFromenvLocked
                (&local_90,(CommandLineFlagParser *)this,fLS::FLAGS_fromenv_abi_cxx11_,set_mode,true
                );
      std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90._M_dataplus._M_p);
    }
    else {
      iVar4 = strcmp(pcVar2,"tryfromenv");
      if (iVar4 != 0) goto LAB_00190318;
      anon_unknown_1::CommandLineFlagParser::ProcessFromenvLocked
                (&local_90,(CommandLineFlagParser *)this,fLS::FLAGS_tryfromenv_abi_cxx11_,set_mode,
                 false);
      std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
LAB_00190318:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == paVar1) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,local_70.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_70.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_70._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,local_70.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = local_70._M_string_length;
  return (string *)local_70._M_string_length;
}

Assistant:

string CommandLineFlagParser::ProcessSingleOptionLocked(
    CommandLineFlag* flag, const char* value, FlagSettingMode set_mode) {
  string msg;
  if (value && !registry_->SetFlagLocked(flag, value, set_mode, &msg)) {
    error_flags_[flag->name()] = msg;
    return "";
  }

  // The recursive flags, --flagfile and --fromenv and --tryfromenv,
  // must be dealt with as soon as they're seen.  They will emit
  // messages of their own.
  if (strcmp(flag->name(), "flagfile") == 0) {
    msg += ProcessFlagfileLocked(FLAGS_flagfile, set_mode);

  } else if (strcmp(flag->name(), "fromenv") == 0) {
    // last arg indicates envval-not-found is fatal (unlike in --tryfromenv)
    msg += ProcessFromenvLocked(FLAGS_fromenv, set_mode, true);

  } else if (strcmp(flag->name(), "tryfromenv") == 0) {
    msg += ProcessFromenvLocked(FLAGS_tryfromenv, set_mode, false);
  }

  return msg;
}